

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void pybind11::class_<kratos::StmtBlock,_std::shared_ptr<kratos::StmtBlock>,_kratos::Stmt>::
     init_holder<kratos::Stmt>
               (instance *inst,value_and_holder *v_h,holder_type *param_3,
               enable_shared_from_this<kratos::Stmt> *param_4)

{
  _Atomic_word *p_Var1;
  byte *pbVar2;
  int iVar3;
  void **ppvVar4;
  instance *piVar5;
  StmtBlock *__p;
  byte bVar6;
  int iVar7;
  void *pvVar8;
  long *plVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long lVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar12;
  
  plVar9 = (long *)((long)*v_h->vh + 0x68);
  if (*v_h->vh == (void *)0x0) {
    plVar9 = (long *)0x0;
  }
  lVar10 = *plVar9;
  p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar9[1];
  this = p_Var11;
  if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var11->_M_weak_count = p_Var11->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var11->_M_weak_count = p_Var11->_M_weak_count + 1;
    }
    if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar7 = p_Var11->_M_use_count;
      do {
        this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (iVar7 == 0) break;
        LOCK();
        iVar3 = p_Var11->_M_use_count;
        bVar12 = iVar7 == iVar3;
        if (bVar12) {
          p_Var11->_M_use_count = iVar7 + 1;
          iVar3 = iVar7;
        }
        iVar7 = iVar3;
        UNLOCK();
        this = p_Var11;
      } while (!bVar12);
    }
  }
  if (this == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    lVar10 = 0;
  }
  else if (this->_M_use_count == 0) {
    lVar10 = 0;
  }
  if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var11->_M_weak_count;
      iVar7 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar7 = p_Var11->_M_weak_count;
      p_Var11->_M_weak_count = iVar7 + -1;
    }
    if (iVar7 == 1) {
      (*p_Var11->_vptr__Sp_counted_base[3])();
    }
  }
  if (lVar10 == 0) {
    pvVar8 = (void *)0x0;
  }
  else {
    pvVar8 = (void *)__dynamic_cast(lVar10,&kratos::Stmt::typeinfo,&kratos::StmtBlock::typeinfo,0);
  }
  p_Var11 = this;
  if (pvVar8 == (void *)0x0) {
    p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) && (pvVar8 != (void *)0x0)) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
      p_Var11 = this;
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
      p_Var11 = this;
    }
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  if (pvVar8 != (void *)0x0) {
    ppvVar4 = v_h->vh;
    ppvVar4[1] = pvVar8;
    ppvVar4[2] = p_Var11;
    piVar5 = v_h->inst;
    if ((piVar5->field_0x30 & 2) == 0) {
      pbVar2 = (piVar5->field_1).nonsimple.status + v_h->index;
      *pbVar2 = *pbVar2 | 1;
    }
    else {
      piVar5->field_0x30 = piVar5->field_0x30 | 4;
    }
    p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  bVar6 = v_h->inst->field_0x30;
  if ((bVar6 & 2) == 0) {
    bVar6 = (v_h->inst->field_1).nonsimple.status[v_h->index] & 1;
  }
  else {
    bVar6 = bVar6 & 4;
  }
  if ((bVar6 == 0) && ((inst->field_0x30 & 1) != 0)) {
    ppvVar4 = v_h->vh;
    __p = (StmtBlock *)*ppvVar4;
    ppvVar4[1] = __p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<kratos::StmtBlock*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(ppvVar4 + 2),__p);
    std::__shared_ptr<kratos::StmtBlock,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<kratos::StmtBlock,kratos::StmtBlock>
              ((__shared_ptr<kratos::StmtBlock,(__gnu_cxx::_Lock_policy)2> *)(ppvVar4 + 1),__p);
    piVar5 = v_h->inst;
    if ((piVar5->field_0x30 & 2) == 0) {
      pbVar2 = (piVar5->field_1).nonsimple.status + v_h->index;
      *pbVar2 = *pbVar2 | 1;
    }
    else {
      piVar5->field_0x30 = piVar5->field_0x30 | 4;
    }
  }
  if (p_Var11 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    return;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
  return;
}

Assistant:

static void init_holder(detail::instance *inst, detail::value_and_holder &v_h,
            const holder_type * /* unused */, const std::enable_shared_from_this<T> * /* dummy */) {

        auto sh = std::dynamic_pointer_cast<typename holder_type::element_type>(
                detail::try_get_shared_from_this(v_h.value_ptr<type>()));
        if (sh) {
            new (std::addressof(v_h.holder<holder_type>())) holder_type(std::move(sh));
            v_h.set_holder_constructed();
        }

        if (!v_h.holder_constructed() && inst->owned) {
            new (std::addressof(v_h.holder<holder_type>())) holder_type(v_h.value_ptr<type>());
            v_h.set_holder_constructed();
        }
    }